

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O2

void __thiscall c4::yml::Tree::_swap_hierarchy(Tree *this,size_t ia,size_t ib)

{
  pfn_error p_Var1;
  code *pcVar2;
  Location LVar3;
  Location LVar4;
  Location LVar5;
  Location LVar6;
  Location LVar7;
  Location LVar8;
  Location LVar9;
  Location LVar10;
  Location LVar11;
  Location LVar12;
  bool bVar13;
  size_t sVar14;
  NodeData *pNVar15;
  NodeData *pNVar16;
  NodeData *pNVar17;
  NodeData *pNVar18;
  size_t i;
  unsigned_long __tmp;
  size_t sVar19;
  undefined8 uVar20;
  csubstr cVar21;
  char msg [39];
  char *pcStack_1a8;
  size_t local_1a0;
  char *pcStack_180;
  size_t local_178;
  char *pcStack_158;
  size_t local_150;
  char *pcStack_130;
  size_t local_128;
  char *pcStack_108;
  size_t local_100;
  char *pcStack_e0;
  size_t local_d8;
  char *pcStack_b8;
  size_t local_b0;
  char *pcStack_90;
  size_t local_88;
  char *pcStack_68;
  size_t local_60;
  char *pcStack_40;
  size_t local_38;
  
  if (ia == ib) {
    return;
  }
  for (sVar14 = first_child(this,ia); sVar14 != 0xffffffffffffffff;
      sVar14 = next_sibling(this,sVar14)) {
    if (sVar14 != ia && sVar14 != ib) {
      pNVar15 = _p(this,sVar14);
      pNVar15->m_parent = ib;
    }
  }
  for (sVar14 = first_child(this,ib); sVar14 != 0xffffffffffffffff;
      sVar14 = next_sibling(this,sVar14)) {
    if (sVar14 != ia && sVar14 != ib) {
      pNVar15 = _p(this,sVar14);
      pNVar15->m_parent = ia;
    }
  }
  pNVar15 = _p(this,ia);
  pNVar16 = _p(this,ib);
  pNVar17 = _p(this,pNVar15->m_parent);
  pNVar18 = _p(this,pNVar16->m_parent);
  sVar14 = pNVar17->m_first_child;
  if (pNVar17 == pNVar18) {
    if ((sVar14 == ib) && (sVar19 = ia, pNVar17->m_last_child == ia)) {
LAB_001c7b52:
      pNVar17->m_first_child = sVar19;
      pNVar17->m_last_child = sVar14;
    }
    else {
      if (sVar14 == ia) {
        sVar19 = ib;
        if (pNVar17->m_last_child == ib) goto LAB_001c7b52;
        pNVar17->m_first_child = ib;
        bVar13 = true;
      }
      else {
        bVar13 = false;
      }
      if (pNVar17->m_last_child == ia) {
        pNVar17->m_last_child = ib;
        bVar13 = true;
      }
      if ((pNVar18->m_first_child == ib) && (!bVar13)) {
        pNVar18->m_first_child = ia;
      }
      if ((pNVar18->m_last_child == ib) && (!bVar13)) goto LAB_001c7b2d;
    }
  }
  else {
    if (sVar14 == ia) {
      pNVar17->m_first_child = ib;
    }
    if (pNVar17->m_last_child == ia) {
      pNVar17->m_last_child = ib;
    }
    if (pNVar18->m_first_child == ib) {
      pNVar18->m_first_child = ia;
    }
    if (pNVar18->m_last_child == ib) {
LAB_001c7b2d:
      pNVar18->m_last_child = ia;
    }
  }
  sVar14 = pNVar15->m_first_child;
  pNVar15->m_first_child = pNVar16->m_first_child;
  pNVar16->m_first_child = sVar14;
  sVar14 = pNVar15->m_last_child;
  pNVar15->m_last_child = pNVar16->m_last_child;
  pNVar16->m_last_child = sVar14;
  sVar14 = pNVar15->m_prev_sibling;
  if (sVar14 == ib) {
    if (pNVar15->m_next_sibling == ib) {
      sVar19 = pNVar16->m_prev_sibling;
      goto LAB_001c7ec2;
    }
    if (pNVar16->m_next_sibling != ia) {
      builtin_strncpy(msg,"check failed: (b.m_next_sibling == ia)",0x27);
      if ((((byte)s_error_flags & 1) != 0) && (bVar13 = is_debugger_attached(), bVar13)) {
        pcVar2 = (code *)swi(3);
        (*pcVar2)();
        return;
      }
      p_Var1 = (this->m_callbacks).m_error;
      cVar21 = to_csubstr(
                         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                         );
      local_b0 = cVar21.len;
      pcStack_b8 = cVar21.str;
      LVar3.super_LineCol.col = 0;
      LVar3.super_LineCol.offset = SUB168(ZEXT816(0x64d0) << 0x40,0);
      LVar3.super_LineCol.line = SUB168(ZEXT816(0x64d0) << 0x40,8);
      LVar3.name.str = pcStack_b8;
      LVar3.name.len = local_b0;
      (*p_Var1)(msg,0x27,LVar3,(this->m_callbacks).m_user_data);
    }
    sVar14 = pNVar16->m_prev_sibling;
    if (sVar14 != 0xffffffffffffffff) {
      if (sVar14 == ia) {
        builtin_strncpy(msg,"check failed: (b.m_prev_sibling != ia)",0x27);
        if ((((byte)s_error_flags & 1) != 0) && (bVar13 = is_debugger_attached(), bVar13)) {
          pcVar2 = (code *)swi(3);
          (*pcVar2)();
          return;
        }
        p_Var1 = (this->m_callbacks).m_error;
        cVar21 = to_csubstr(
                           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                           );
        local_d8 = cVar21.len;
        pcStack_e0 = cVar21.str;
        LVar4.super_LineCol.col = 0;
        LVar4.super_LineCol.offset = SUB168(ZEXT816(0x64d3) << 0x40,0);
        LVar4.super_LineCol.line = SUB168(ZEXT816(0x64d3) << 0x40,8);
        LVar4.name.str = pcStack_e0;
        LVar4.name.len = local_d8;
        (*p_Var1)(msg,0x27,LVar4,(this->m_callbacks).m_user_data);
        sVar14 = pNVar16->m_prev_sibling;
      }
      pNVar17 = _p(this,sVar14);
      pNVar17->m_next_sibling = ia;
    }
    sVar14 = pNVar15->m_next_sibling;
    if (sVar14 != 0xffffffffffffffff) {
      if (sVar14 == ib) {
        builtin_strncpy(msg,"check failed: (a.m_next_sibling != ib)",0x27);
        if ((((byte)s_error_flags & 1) != 0) && (bVar13 = is_debugger_attached(), bVar13)) {
          pcVar2 = (code *)swi(3);
          (*pcVar2)();
          return;
        }
        p_Var1 = (this->m_callbacks).m_error;
        cVar21 = to_csubstr(
                           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                           );
        local_100 = cVar21.len;
        pcStack_108 = cVar21.str;
        LVar5.super_LineCol.col = 0;
        LVar5.super_LineCol.offset = SUB168(ZEXT816(0x64d8) << 0x40,0);
        LVar5.super_LineCol.line = SUB168(ZEXT816(0x64d8) << 0x40,8);
        LVar5.name.str = pcStack_108;
        LVar5.name.len = local_100;
        (*p_Var1)(msg,0x27,LVar5,(this->m_callbacks).m_user_data);
        sVar14 = pNVar15->m_next_sibling;
      }
      pNVar17 = _p(this,sVar14);
      pNVar17->m_prev_sibling = ib;
    }
    sVar14 = pNVar16->m_prev_sibling;
    pNVar15->m_prev_sibling = sVar14;
    pNVar15->m_next_sibling = ib;
    pNVar16->m_prev_sibling = ia;
LAB_001c7ead:
    pNVar16->m_next_sibling = sVar14;
  }
  else {
    sVar19 = pNVar16->m_prev_sibling;
    i = pNVar15->m_next_sibling;
    if (sVar19 != ia) {
      if (i == ib) goto LAB_001c7ec2;
      if (pNVar16->m_next_sibling != ia) {
        if (sVar14 != 0xffffffffffffffff) {
          pNVar17 = _p(this,sVar14);
          pNVar17->m_next_sibling = ib;
          i = pNVar15->m_next_sibling;
        }
        if (i != ib && i != 0xffffffffffffffff) {
          pNVar17 = _p(this,i);
          pNVar17->m_prev_sibling = ib;
        }
        sVar14 = pNVar16->m_prev_sibling;
        if (sVar14 != ia && sVar14 != 0xffffffffffffffff) {
          pNVar17 = _p(this,sVar14);
          pNVar17->m_next_sibling = ia;
        }
        sVar14 = pNVar16->m_next_sibling;
        if (sVar14 != ia && sVar14 != 0xffffffffffffffff) {
          pNVar17 = _p(this,sVar14);
          pNVar17->m_prev_sibling = ia;
        }
        sVar14 = pNVar15->m_prev_sibling;
        pNVar15->m_prev_sibling = pNVar16->m_prev_sibling;
        pNVar16->m_prev_sibling = sVar14;
        sVar14 = pNVar15->m_next_sibling;
        pNVar15->m_next_sibling = pNVar16->m_next_sibling;
        goto LAB_001c7ead;
      }
    }
    if (i != ib) {
      if ((((byte)s_error_flags & 1) != 0) && (bVar13 = is_debugger_attached(), bVar13)) {
        pcVar2 = (code *)swi(3);
        (*pcVar2)();
        return;
      }
      uVar20 = 0x64e3;
      goto LAB_001c856f;
    }
LAB_001c7ec2:
    if (sVar19 != ia) {
      builtin_strncpy(msg,"check failed: (b.m_prev_sibling == ia)",0x27);
      if ((((byte)s_error_flags & 1) != 0) && (bVar13 = is_debugger_attached(), bVar13)) {
        pcVar2 = (code *)swi(3);
        (*pcVar2)();
        return;
      }
      p_Var1 = (this->m_callbacks).m_error;
      cVar21 = to_csubstr(
                         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                         );
      local_38 = cVar21.len;
      pcStack_40 = cVar21.str;
      LVar6.super_LineCol.col = 0;
      LVar6.super_LineCol.offset = SUB168(ZEXT816(0x64bd) << 0x40,0);
      LVar6.super_LineCol.line = SUB168(ZEXT816(0x64bd) << 0x40,8);
      LVar6.name.str = pcStack_40;
      LVar6.name.len = local_38;
      (*p_Var1)(msg,0x27,LVar6,(this->m_callbacks).m_user_data);
      sVar14 = pNVar15->m_prev_sibling;
    }
    if (sVar14 != 0xffffffffffffffff) {
      if (sVar14 == ib) {
        builtin_strncpy(msg,"check failed: (a.m_prev_sibling != ib)",0x27);
        if ((((byte)s_error_flags & 1) != 0) && (bVar13 = is_debugger_attached(), bVar13)) {
          pcVar2 = (code *)swi(3);
          (*pcVar2)();
          return;
        }
        p_Var1 = (this->m_callbacks).m_error;
        cVar21 = to_csubstr(
                           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                           );
        local_60 = cVar21.len;
        pcStack_68 = cVar21.str;
        LVar7.super_LineCol.col = 0;
        LVar7.super_LineCol.offset = SUB168(ZEXT816(0x64c0) << 0x40,0);
        LVar7.super_LineCol.line = SUB168(ZEXT816(0x64c0) << 0x40,8);
        LVar7.name.str = pcStack_68;
        LVar7.name.len = local_60;
        (*p_Var1)(msg,0x27,LVar7,(this->m_callbacks).m_user_data);
        sVar14 = pNVar15->m_prev_sibling;
      }
      pNVar17 = _p(this,sVar14);
      pNVar17->m_next_sibling = ib;
    }
    sVar14 = pNVar16->m_next_sibling;
    if (sVar14 == 0xffffffffffffffff) {
      sVar14 = 0xffffffffffffffff;
    }
    else {
      if (sVar14 == ia) {
        builtin_strncpy(msg,"check failed: (b.m_next_sibling != ia)",0x27);
        if ((((byte)s_error_flags & 1) != 0) && (bVar13 = is_debugger_attached(), bVar13)) {
          pcVar2 = (code *)swi(3);
          (*pcVar2)();
          return;
        }
        p_Var1 = (this->m_callbacks).m_error;
        cVar21 = to_csubstr(
                           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                           );
        local_88 = cVar21.len;
        pcStack_90 = cVar21.str;
        LVar8.super_LineCol.col = 0;
        LVar8.super_LineCol.offset = SUB168(ZEXT816(0x64c5) << 0x40,0);
        LVar8.super_LineCol.line = SUB168(ZEXT816(0x64c5) << 0x40,8);
        LVar8.name.str = pcStack_90;
        LVar8.name.len = local_88;
        (*p_Var1)(msg,0x27,LVar8,(this->m_callbacks).m_user_data);
        sVar14 = pNVar16->m_next_sibling;
      }
      pNVar17 = _p(this,sVar14);
      pNVar17->m_prev_sibling = ia;
      sVar14 = pNVar16->m_next_sibling;
    }
    pNVar16->m_prev_sibling = pNVar15->m_prev_sibling;
    pNVar16->m_next_sibling = ia;
    pNVar15->m_prev_sibling = ib;
    pNVar15->m_next_sibling = sVar14;
  }
  if (pNVar15->m_next_sibling == ia) {
    builtin_strncpy(msg,"check failed: (a.m_next_sibling != ia)",0x27);
    if ((((byte)s_error_flags & 1) != 0) && (bVar13 = is_debugger_attached(), bVar13)) {
      pcVar2 = (code *)swi(3);
      (*pcVar2)();
      return;
    }
    p_Var1 = (this->m_callbacks).m_error;
    cVar21 = to_csubstr(
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                       );
    local_128 = cVar21.len;
    pcStack_130 = cVar21.str;
    LVar9.super_LineCol.col = 0;
    LVar9.super_LineCol.offset = SUB168(ZEXT816(0x64e6) << 0x40,0);
    LVar9.super_LineCol.line = SUB168(ZEXT816(0x64e6) << 0x40,8);
    LVar9.name.str = pcStack_130;
    LVar9.name.len = local_128;
    (*p_Var1)(msg,0x27,LVar9,(this->m_callbacks).m_user_data);
  }
  if (pNVar15->m_prev_sibling == ia) {
    builtin_strncpy(msg,"check failed: (a.m_prev_sibling != ia)",0x27);
    if ((((byte)s_error_flags & 1) != 0) && (bVar13 = is_debugger_attached(), bVar13)) {
      pcVar2 = (code *)swi(3);
      (*pcVar2)();
      return;
    }
    p_Var1 = (this->m_callbacks).m_error;
    cVar21 = to_csubstr(
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                       );
    local_150 = cVar21.len;
    pcStack_158 = cVar21.str;
    LVar10.super_LineCol.col = 0;
    LVar10.super_LineCol.offset = SUB168(ZEXT816(0x64e7) << 0x40,0);
    LVar10.super_LineCol.line = SUB168(ZEXT816(0x64e7) << 0x40,8);
    LVar10.name.str = pcStack_158;
    LVar10.name.len = local_150;
    (*p_Var1)(msg,0x27,LVar10,(this->m_callbacks).m_user_data);
  }
  if (pNVar16->m_next_sibling == ib) {
    builtin_strncpy(msg,"check failed: (b.m_next_sibling != ib)",0x27);
    if ((((byte)s_error_flags & 1) != 0) && (bVar13 = is_debugger_attached(), bVar13)) {
      pcVar2 = (code *)swi(3);
      (*pcVar2)();
      return;
    }
    p_Var1 = (this->m_callbacks).m_error;
    cVar21 = to_csubstr(
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                       );
    local_178 = cVar21.len;
    pcStack_180 = cVar21.str;
    LVar11.super_LineCol.col = 0;
    LVar11.super_LineCol.offset = SUB168(ZEXT816(0x64e8) << 0x40,0);
    LVar11.super_LineCol.line = SUB168(ZEXT816(0x64e8) << 0x40,8);
    LVar11.name.str = pcStack_180;
    LVar11.name.len = local_178;
    (*p_Var1)(msg,0x27,LVar11,(this->m_callbacks).m_user_data);
  }
  if (pNVar16->m_prev_sibling == ib) {
    builtin_strncpy(msg,"check failed: (b.m_prev_sibling != ib)",0x27);
    if ((((byte)s_error_flags & 1) != 0) && (bVar13 = is_debugger_attached(), bVar13)) {
      pcVar2 = (code *)swi(3);
      (*pcVar2)();
      return;
    }
    p_Var1 = (this->m_callbacks).m_error;
    cVar21 = to_csubstr(
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                       );
    local_1a0 = cVar21.len;
    pcStack_1a8 = cVar21.str;
    LVar12.super_LineCol.col = 0;
    LVar12.super_LineCol.offset = SUB168(ZEXT816(0x64e9) << 0x40,0);
    LVar12.super_LineCol.line = SUB168(ZEXT816(0x64e9) << 0x40,8);
    LVar12.name.str = pcStack_1a8;
    LVar12.name.len = local_1a0;
    (*p_Var1)(msg,0x27,LVar12,(this->m_callbacks).m_user_data);
  }
  sVar14 = pNVar15->m_parent;
  sVar19 = pNVar16->m_parent;
  if (sVar14 == ib) {
    if (sVar19 == ia) {
      if ((((byte)s_error_flags & 1) != 0) && (bVar13 = is_debugger_attached(), bVar13)) {
        pcVar2 = (code *)swi(3);
        (*pcVar2)();
        return;
      }
      uVar20 = 0x64fd;
LAB_001c856f:
      handle_error(0x20ca73,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                   ,uVar20);
    }
    pNVar15->m_parent = sVar19;
    pNVar16->m_parent = ia;
  }
  else if (sVar19 == ia) {
    pNVar16->m_parent = sVar14;
    pNVar15->m_parent = ib;
  }
  else {
    pNVar15->m_parent = sVar19;
    pNVar16->m_parent = sVar14;
  }
  return;
}

Assistant:

void Tree::_swap_hierarchy(size_t ia, size_t ib)
{
    if(ia == ib) return;

    for(size_t i = first_child(ia); i != NONE; i = next_sibling(i))
    {
        if(i == ib || i == ia)
            continue;
        _p(i)->m_parent = ib;
    }

    for(size_t i = first_child(ib); i != NONE; i = next_sibling(i))
    {
        if(i == ib || i == ia)
            continue;
        _p(i)->m_parent = ia;
    }

    auto & C4_RESTRICT a  = *_p(ia);
    auto & C4_RESTRICT b  = *_p(ib);
    auto & C4_RESTRICT pa = *_p(a.m_parent);
    auto & C4_RESTRICT pb = *_p(b.m_parent);

    if(&pa == &pb)
    {
        if((pa.m_first_child == ib && pa.m_last_child == ia)
            ||
           (pa.m_first_child == ia && pa.m_last_child == ib))
        {
            std::swap(pa.m_first_child, pa.m_last_child);
        }
        else
        {
            bool changed = false;
            if(pa.m_first_child == ia)
            {
                pa.m_first_child = ib;
                changed = true;
            }
            if(pa.m_last_child  == ia)
            {
                pa.m_last_child = ib;
                changed = true;
            }
            if(pb.m_first_child == ib && !changed)
            {
                pb.m_first_child = ia;
            }
            if(pb.m_last_child  == ib && !changed)
            {
                pb.m_last_child  = ia;
            }
        }
    }
    else
    {
        if(pa.m_first_child == ia)
            pa.m_first_child = ib;
        if(pa.m_last_child  == ia)
            pa.m_last_child  = ib;
        if(pb.m_first_child == ib)
            pb.m_first_child = ia;
        if(pb.m_last_child  == ib)
            pb.m_last_child  = ia;
    }
    std::swap(a.m_first_child , b.m_first_child);
    std::swap(a.m_last_child  , b.m_last_child);

    if(a.m_prev_sibling != ib && b.m_prev_sibling != ia &&
       a.m_next_sibling != ib && b.m_next_sibling != ia)
    {
        if(a.m_prev_sibling != NONE && a.m_prev_sibling != ib)
            _p(a.m_prev_sibling)->m_next_sibling = ib;
        if(a.m_next_sibling != NONE && a.m_next_sibling != ib)
            _p(a.m_next_sibling)->m_prev_sibling = ib;
        if(b.m_prev_sibling != NONE && b.m_prev_sibling != ia)
            _p(b.m_prev_sibling)->m_next_sibling = ia;
        if(b.m_next_sibling != NONE && b.m_next_sibling != ia)
            _p(b.m_next_sibling)->m_prev_sibling = ia;
        std::swap(a.m_prev_sibling, b.m_prev_sibling);
        std::swap(a.m_next_sibling, b.m_next_sibling);
    }
    else
    {
        if(a.m_next_sibling == ib) // n will go after m
        {
            _RYML_CB_ASSERT(m_callbacks, b.m_prev_sibling == ia);
            if(a.m_prev_sibling != NONE)
            {
                _RYML_CB_ASSERT(m_callbacks, a.m_prev_sibling != ib);
                _p(a.m_prev_sibling)->m_next_sibling = ib;
            }
            if(b.m_next_sibling != NONE)
            {
                _RYML_CB_ASSERT(m_callbacks, b.m_next_sibling != ia);
                _p(b.m_next_sibling)->m_prev_sibling = ia;
            }
            size_t ns = b.m_next_sibling;
            b.m_prev_sibling = a.m_prev_sibling;
            b.m_next_sibling = ia;
            a.m_prev_sibling = ib;
            a.m_next_sibling = ns;
        }
        else if(a.m_prev_sibling == ib) // m will go after n
        {
            _RYML_CB_ASSERT(m_callbacks, b.m_next_sibling == ia);
            if(b.m_prev_sibling != NONE)
            {
                _RYML_CB_ASSERT(m_callbacks, b.m_prev_sibling != ia);
                _p(b.m_prev_sibling)->m_next_sibling = ia;
            }
            if(a.m_next_sibling != NONE)
            {
                _RYML_CB_ASSERT(m_callbacks, a.m_next_sibling != ib);
                _p(a.m_next_sibling)->m_prev_sibling = ib;
            }
            size_t ns = b.m_prev_sibling;
            a.m_prev_sibling = b.m_prev_sibling;
            a.m_next_sibling = ib;
            b.m_prev_sibling = ia;
            b.m_next_sibling = ns;
        }
        else
        {
            C4_NEVER_REACH();
        }
    }
    _RYML_CB_ASSERT(m_callbacks, a.m_next_sibling != ia);
    _RYML_CB_ASSERT(m_callbacks, a.m_prev_sibling != ia);
    _RYML_CB_ASSERT(m_callbacks, b.m_next_sibling != ib);
    _RYML_CB_ASSERT(m_callbacks, b.m_prev_sibling != ib);

    if(a.m_parent != ib && b.m_parent != ia)
    {
        std::swap(a.m_parent, b.m_parent);
    }
    else
    {
        if(a.m_parent == ib && b.m_parent != ia)
        {
            a.m_parent = b.m_parent;
            b.m_parent = ia;
        }
        else if(a.m_parent != ib && b.m_parent == ia)
        {
            b.m_parent = a.m_parent;
            a.m_parent = ib;
        }
        else
        {
            C4_NEVER_REACH();
        }
    }
}